

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

void Abc_NtkCollectAddOne
               (int iNtk,int iObj,int iGiaLit,Gia_Man_t *pGia,Vec_Int_t *vGia2Cla,Vec_Int_t **vNexts
               )

{
  undefined8 uVar1;
  undefined8 uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  
  if (iGiaLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar5 = (uint)iGiaLit >> 1;
  uVar4 = (uint)pGia->pReprs[uVar5] & 0xfffffff;
  if (uVar4 == 0xfffffff) {
    uVar4 = uVar5;
  }
  if ((pGia->nObjs <= (int)uVar4) || (pGia->nObjs <= (int)uVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (iObj < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  if ((int)uVar4 < vGia2Cla->nSize) {
    if (iObj < vNexts[(uint)iNtk]->nSize) {
      uVar1 = *(undefined8 *)(pGia->pObjs + uVar4);
      uVar2 = *(undefined8 *)(pGia->pObjs + uVar5);
      piVar3 = vGia2Cla->pArray;
      vNexts[(uint)iNtk]->pArray[(uint)iObj] = piVar3[uVar4];
      if ((int)uVar4 < vGia2Cla->nSize) {
        piVar3[uVar4] =
             iNtk + iObj * 4 +
             ((uint)((ulong)uVar2 >> 0x3f) ^ iGiaLit & 1U ^ (uint)((ulong)uVar1 >> 0x3f)) * 2;
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void Abc_NtkCollectAddOne( int iNtk, int iObj, int iGiaLit, Gia_Man_t * pGia, Vec_Int_t * vGia2Cla, Vec_Int_t * vNexts[2] )
{
    int iRepr = Gia_ObjReprSelf( pGia, Abc_Lit2Var(iGiaLit) );
    int Compl = Abc_LitIsCompl(iGiaLit) ^ Gia_ObjPhase(Gia_ManObj(pGia, iRepr)) ^ Gia_ObjPhase(Gia_ManObj(pGia, Abc_Lit2Var(iGiaLit)));
    int Added = Abc_Var2Lit( Abc_Var2Lit(iObj, Compl), iNtk );
    int Entry = Vec_IntEntry( vGia2Cla, iRepr );
    Vec_IntWriteEntry( vNexts[iNtk], iObj, Entry );
    Vec_IntWriteEntry( vGia2Cla, iRepr, Added );
}